

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

int8_t av1_ref_frame_type(MV_REFERENCE_FRAME *rf)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  
  cVar2 = *rf;
  bVar1 = rf[1];
  if ('\0' < (char)bVar1) {
    if (bVar1 < 5 || '\x04' < cVar2) {
      for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
        if ((cVar2 == (&comp_ref0_lut)[lVar3]) && (bVar1 == (&comp_ref1_lut)[lVar3])) {
          return (char)lVar3 + '\x14';
        }
      }
    }
    cVar2 = bVar1 * '\x04' + cVar2 + -0xd;
  }
  return cVar2;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}